

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls1_prf.c
# Opt level: O0

int kdf_tls1_prf_derive(void *vctx,uchar *key,size_t keylen,OSSL_PARAM *params)

{
  int iVar1;
  OSSL_PARAM *in_RDX;
  uchar *in_RSI;
  char *in_RDI;
  EVP_MAC_CTX *unaff_retaddr;
  EVP_MAC_CTX *in_stack_00000008;
  TLS1_PRF *ctx;
  char *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  char *slen;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  slen = in_RDI;
  iVar1 = ossl_prov_is_running();
  if ((iVar1 == 0) || (iVar1 = kdf_tls1_prf_set_ctx_params(in_RSI,in_RDX), iVar1 == 0)) {
    return 0;
  }
  if (*(long *)(in_RDI + 8) == 0) {
    ERR_new();
    ERR_set_debug(in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
    ERR_set_error(0x39,0x81,(char *)0x0);
    return 0;
  }
  if (*(long *)(in_RDI + 0x18) == 0) {
    ERR_new();
    ERR_set_debug(in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
    ERR_set_error(0x39,0x84,(char *)0x0);
    return 0;
  }
  if (*(long *)(in_RDI + 0x428) == 0) {
    ERR_new();
    ERR_set_debug(in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
    ERR_set_error(0x39,0x8c,(char *)0x0);
    return 0;
  }
  if (in_RDX == (OSSL_PARAM *)0x0) {
    ERR_new();
    ERR_set_debug(in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
    ERR_set_error(0x39,0x69,(char *)0x0);
    return 0;
  }
  iVar1 = tls1_prf_alg(in_stack_00000008,unaff_retaddr,
                       (uchar *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (size_t)slen,in_RSI,(size_t)in_RDX,(uchar *)params,keylen);
  return iVar1;
}

Assistant:

static int kdf_tls1_prf_derive(void *vctx, unsigned char *key, size_t keylen,
                               const OSSL_PARAM params[])
{
    TLS1_PRF *ctx = (TLS1_PRF *)vctx;

    if (!ossl_prov_is_running() || !kdf_tls1_prf_set_ctx_params(ctx, params))
        return 0;

    if (ctx->P_hash == NULL) {
        ERR_raise(ERR_LIB_PROV, PROV_R_MISSING_MESSAGE_DIGEST);
        return 0;
    }
    if (ctx->sec == NULL) {
        ERR_raise(ERR_LIB_PROV, PROV_R_MISSING_SECRET);
        return 0;
    }
    if (ctx->seedlen == 0) {
        ERR_raise(ERR_LIB_PROV, PROV_R_MISSING_SEED);
        return 0;
    }
    if (keylen == 0) {
        ERR_raise(ERR_LIB_PROV, PROV_R_INVALID_KEY_LENGTH);
        return 0;
    }

    return tls1_prf_alg(ctx->P_hash, ctx->P_sha1,
                        ctx->sec, ctx->seclen,
                        ctx->seed, ctx->seedlen,
                        key, keylen);
}